

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::ConvertToFullPath
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *localPath)

{
  string *str;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  undefined1 local_21;
  string *local_20;
  string *localPath_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  string *dir;
  
  local_21 = 0;
  local_20 = localPath;
  localPath_local = (string *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmAlphaNum::cmAlphaNum(&local_58,str);
  cmAlphaNum::cmAlphaNum(&local_88,'/');
  cmStrCat<std::__cxx11::string>(__return_storage_ptr__,&local_58,&local_88,local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::ConvertToFullPath(
  const std::string& localPath)
{
  std::string dir =
    cmStrCat(this->GetCurrentBinaryDirectory(), '/', localPath);
  return dir;
}